

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O3

TPM_RC TPMT_SENSITIVE_Unmarshal(TPMT_SENSITIVE *target,BYTE **buffer,INT32 *size)

{
  TPM_RC TVar1;
  
  TVar1 = TPMI_ALG_PUBLIC_Unmarshal(&target->sensitiveType,buffer,size);
  if (TVar1 == 0) {
    TVar1 = TPM2B_DIGEST_Unmarshal(&target->authValue,buffer,size);
    if (TVar1 == 0) {
      TVar1 = TPM2B_DIGEST_Unmarshal(&target->seedValue,buffer,size);
      if (TVar1 == 0) {
        TVar1 = TPMU_SENSITIVE_COMPOSITE_Unmarshal
                          (&target->sensitive,buffer,size,(uint)target->sensitiveType);
        return TVar1;
      }
    }
  }
  return TVar1;
}

Assistant:

TPM_RC
TPMT_SENSITIVE_Unmarshal(TPMT_SENSITIVE *target, BYTE **buffer, INT32 *size)
{
    TPM_RC    result;
    result = TPMI_ALG_PUBLIC_Unmarshal((TPMI_ALG_PUBLIC *)&(target->sensitiveType), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPM2B_AUTH_Unmarshal((TPM2B_AUTH *)&(target->authValue), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPM2B_DIGEST_Unmarshal((TPM2B_DIGEST *)&(target->seedValue), buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    result = TPMU_SENSITIVE_COMPOSITE_Unmarshal((TPMU_SENSITIVE_COMPOSITE *)&(target->sensitive), buffer, size, (UINT32)target->sensitiveType);
    return result;
}